

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O0

int main(int argc,char **argv)

{
  void *pvVar1;
  float fVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  int i_6;
  int32_t *output_3;
  ggml_cgraph *graph_3;
  ggml_tensor *m4;
  ggml_tensor *args [5];
  ggml_tensor *t5;
  ggml_tensor *t4;
  ggml_tensor *t3_1;
  ggml_tensor *t2_2;
  ggml_tensor *t1_2;
  ggml_context *ctx_3;
  int i_5;
  float *output_2;
  ggml_cgraph *graph_2;
  ggml_tensor *m3;
  ggml_tensor *t3;
  ggml_tensor *t2_1;
  ggml_tensor *t1_1;
  ggml_context *ctx_2;
  int i_4;
  float *output_1;
  ggml_cgraph *graph_1;
  ggml_tensor *m2;
  ggml_tensor *t2;
  ggml_tensor *t1;
  ggml_context *ctx_1;
  int i_3;
  float *output;
  ggml_cgraph *graph;
  ggml_tensor *m1;
  ggml_tensor *t;
  ggml_context *ctx;
  int i_2;
  float buf3_f32 [1024];
  int i_1;
  float buf2_f32 [1024];
  int i;
  float buf1_f32 [1024];
  int local_3164;
  long local_3148;
  long local_3140;
  long local_3138;
  long local_3130;
  long local_3128;
  long local_3118;
  long local_3110;
  long local_3108;
  long local_3100;
  long local_30f8;
  ggml_context *local_30f0;
  int local_30e4;
  long local_30e0;
  undefined8 local_30d8;
  undefined8 local_30d0;
  long local_30c8;
  long local_30c0;
  long local_30b8;
  ggml_context *local_30b0;
  int local_30a4;
  long local_30a0;
  undefined8 local_3098;
  undefined8 local_3090;
  long local_3088;
  long local_3080;
  ggml_context *local_3078;
  int local_306c;
  long local_3068;
  undefined8 local_3060;
  undefined8 local_3058;
  long local_3050;
  ggml_context *local_3048;
  int local_303c;
  float local_3038 [1027];
  int local_202c;
  float local_2028 [1027];
  int local_101c;
  float local_1018 [1029];
  undefined4 local_4;
  
  local_4 = 0;
  for (local_101c = 0; local_101c < 0x400; local_101c = local_101c + 1) {
    local_1018[local_101c] = (float)(local_101c + 1);
  }
  for (local_202c = 0; local_202c < 0x400; local_202c = local_202c + 1) {
    local_2028[local_202c] = (float)(local_202c + 1) * 2.0;
  }
  for (local_303c = 0; local_303c < 0x400; local_303c = local_303c + 1) {
    local_3038[local_303c] = (float)(local_303c + 1) * 3.0;
  }
  local_3048 = make_ctx();
  local_3050 = ggml_new_tensor_2d(local_3048,0,10,2);
  pvVar1 = *(void **)(local_3050 + 0xf8);
  sVar4 = ggml_nbytes(local_3050);
  memcpy(pvVar1,local_1018,sVar4);
  local_3058 = ggml_map_custom1(local_3048,local_3050,custom1,2,0);
  local_3060 = ggml_new_graph(local_3048);
  ggml_build_forward_expand(local_3060,local_3058);
  ggml_graph_compute_with_ctx(local_3048,local_3060,4);
  local_3068 = ggml_get_data_f32(local_3058);
  for (local_306c = 0; lVar5 = (long)local_306c, lVar6 = ggml_nelements(local_3058), lVar5 < lVar6;
      local_306c = local_306c + 1) {
    fVar9 = *(float *)(local_3068 + (long)local_306c * 4);
    if ((fVar9 != local_1018[local_306c] * 2.0) || (NAN(fVar9) || NAN(local_1018[local_306c] * 2.0))
       ) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                 ,0xc9,"GGML_ASSERT(%s) failed","output[i] == buf1_f32[i] * 2");
    }
  }
  if (g_custom1_count != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0xcb,"GGML_ASSERT(%s) failed","g_custom1_count == 2");
  }
  ggml_free(local_3048);
  local_3078 = make_ctx();
  local_3080 = ggml_new_tensor_2d(local_3078,0,10,2);
  local_3088 = ggml_new_tensor_2d(local_3078,0,10,2);
  pvVar1 = *(void **)(local_3080 + 0xf8);
  sVar4 = ggml_nbytes(local_3080);
  memcpy(pvVar1,local_1018,sVar4);
  pvVar1 = *(void **)(local_3088 + 0xf8);
  sVar4 = ggml_nbytes(local_3088);
  memcpy(pvVar1,local_2028,sVar4);
  local_3090 = ggml_map_custom2(local_3078,local_3080,local_3088,custom2,0xffffffff,g_userdata);
  local_3098 = ggml_new_graph(local_3078);
  ggml_build_forward_expand(local_3098,local_3090);
  ggml_graph_compute_with_ctx(local_3078,local_3098,4);
  local_30a0 = ggml_get_data_f32(local_3090);
  for (local_30a4 = 0; lVar5 = (long)local_30a4, lVar6 = ggml_nelements(local_3090), lVar5 < lVar6;
      local_30a4 = local_30a4 + 1) {
    fVar9 = *(float *)(local_30a0 + (long)local_30a4 * 4);
    if ((fVar9 != local_1018[local_30a4] + local_2028[local_30a4]) ||
       (NAN(fVar9) || NAN(local_1018[local_30a4] + local_2028[local_30a4]))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                 ,0xe3,"GGML_ASSERT(%s) failed","output[i] == buf1_f32[i] + buf2_f32[i]");
    }
  }
  if (g_custom2_count != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0xe6,"GGML_ASSERT(%s) failed","g_custom2_count == 4");
  }
  ggml_free(local_3078);
  local_30b0 = make_ctx();
  local_30b8 = ggml_new_tensor_2d(local_30b0,0,10,2);
  local_30c0 = ggml_new_tensor_2d(local_30b0,0,10,2);
  local_30c8 = ggml_new_tensor_2d(local_30b0,0,10,2);
  pvVar1 = *(void **)(local_30b8 + 0xf8);
  sVar4 = ggml_nbytes(local_30b8);
  memcpy(pvVar1,local_1018,sVar4);
  pvVar1 = *(void **)(local_30c0 + 0xf8);
  sVar4 = ggml_nbytes(local_30c0);
  memcpy(pvVar1,local_2028,sVar4);
  pvVar1 = *(void **)(local_30c8 + 0xf8);
  sVar4 = ggml_nbytes(local_30c8);
  memcpy(pvVar1,local_3038,sVar4);
  local_30d0 = ggml_map_custom3(local_30b0,local_30b8,local_30c0,local_30c8,custom3,1,g_userdata);
  local_30d8 = ggml_new_graph(local_30b0);
  ggml_build_forward_expand(local_30d8,local_30d0);
  ggml_graph_compute_with_ctx(local_30b0,local_30d8,4);
  local_30e0 = ggml_get_data_f32(local_30d0);
  for (local_30e4 = 0; lVar5 = (long)local_30e4, lVar6 = ggml_nelements(local_30d0), lVar5 < lVar6;
      local_30e4 = local_30e4 + 1) {
    fVar9 = *(float *)(local_30e0 + (long)local_30e4 * 4);
    fVar2 = local_1018[local_30e4] + local_2028[local_30e4] + local_3038[local_30e4];
    if ((fVar9 != fVar2) || (NAN(fVar9) || NAN(fVar2))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                 ,0x101,"GGML_ASSERT(%s) failed",
                 "output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]");
    }
  }
  if (g_custom3_count != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x104,"GGML_ASSERT(%s) failed","g_custom3_count == 1");
  }
  ggml_free(local_30b0);
  local_30f0 = make_ctx();
  local_30f8 = ggml_new_tensor_2d(local_30f0,0,10,2);
  local_3100 = ggml_new_tensor_2d(local_30f0,0,10,2);
  local_3108 = ggml_new_tensor_2d(local_30f0,0,10,2);
  local_3110 = ggml_new_tensor_2d(local_30f0,0,10,2);
  local_3118 = ggml_new_tensor_2d(local_30f0,0,10,2);
  pvVar1 = *(void **)(local_30f8 + 0xf8);
  sVar4 = ggml_nbytes(local_30f8);
  memcpy(pvVar1,local_1018,sVar4);
  pvVar1 = *(void **)(local_3100 + 0xf8);
  sVar4 = ggml_nbytes(local_3100);
  memcpy(pvVar1,local_2028,sVar4);
  pvVar1 = *(void **)(local_3108 + 0xf8);
  sVar4 = ggml_nbytes(local_3108);
  memcpy(pvVar1,local_3038,sVar4);
  pvVar1 = *(void **)(local_3110 + 0xf8);
  sVar4 = ggml_nbytes(local_3110);
  memcpy(pvVar1,local_1018,sVar4);
  pvVar1 = *(void **)(local_3118 + 0xf8);
  sVar4 = ggml_nbytes(local_3118);
  memcpy(pvVar1,local_2028,sVar4);
  local_3148 = local_30f8;
  local_3140 = local_3100;
  local_3138 = local_3108;
  local_3130 = local_3110;
  local_3128 = local_3118;
  uVar7 = ggml_custom_4d(local_30f0,0x1a,10,2,1,1,&local_3148,5,custom,0xffffffff,g_userdata);
  uVar8 = ggml_new_graph(local_30f0);
  ggml_build_forward_expand(uVar8,uVar7);
  ggml_graph_compute_with_ctx(local_30f0,uVar8,4);
  lVar5 = ggml_get_data(uVar7);
  for (local_3164 = 0; lVar6 = ggml_nelements(uVar7), local_3164 < lVar6;
      local_3164 = local_3164 + 1) {
    fVar9 = (float)*(int *)(lVar5 + (long)local_3164 * 4);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_3038[local_3164]),
                             ZEXT416((uint)local_2028[local_3164]),
                             ZEXT416((uint)local_1018[local_3164]));
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_2028[local_3164]),
                             ZEXT416((uint)-local_1018[local_3164]),auVar3);
    if ((fVar9 != auVar3._0_4_) || (NAN(fVar9) || NAN(auVar3._0_4_))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                 ,0x125,"GGML_ASSERT(%s) failed",
                 "output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]")
      ;
    }
  }
  ggml_free(local_30f0);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {

    float buf1_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf1_f32[i] = (float)(i + 1);
    }
    float buf2_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf2_f32[i] = (float)(i + 1) * 2;
    }
    float buf3_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf3_f32[i] = (float)(i + 1) * 3;
    }

    // map_custom1
    // 2 tasks, no userdata, parallelized by elements
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t->data, buf1_f32, ggml_nbytes(t));

        struct ggml_tensor * m1 = ggml_map_custom1(ctx, t, custom1, 2, NULL);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m1);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m1);

        for (int i = 0; i < ggml_nelements(m1); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] * 2);
        }
        GGML_ASSERT(g_custom1_count == 2);

        ggml_free(ctx);
    }

    // map_custom2
    // max tasks (4), userdata, parallelized by rows
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));

        struct ggml_tensor * m2 = ggml_map_custom2(ctx, t1, t2, custom2, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m2);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m2);

        for (int i = 0; i < ggml_nelements(m2); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i]);
        }

        GGML_ASSERT(g_custom2_count == 4);

        ggml_free(ctx);
    }

    // map_custom3
    // 1 task, userdata, not parallelized
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);

        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));

        struct ggml_tensor * m3 = ggml_map_custom3(ctx, t1, t2, t3, custom3, 1, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m3);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m3);

        for (int i = 0; i < ggml_nelements(m3); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]);
        }

        GGML_ASSERT(g_custom3_count == 1);

        ggml_free(ctx);
    }

    // custom
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t4 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t5 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));
        memcpy(t4->data, buf1_f32, ggml_nbytes(t4));
        memcpy(t5->data, buf2_f32, ggml_nbytes(t5));

        struct ggml_tensor * args[] = {
            t1, t2, t3, t4, t5,
        };

        struct ggml_tensor * m4 = ggml_custom_4d(ctx, GGML_TYPE_I32, 10, 2, 1, 1, args, sizeof(args)/sizeof(args[0]), custom, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m4);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const int32_t * output = (const int32_t *) ggml_get_data(m4);

        for (int i = 0; i < ggml_nelements(m4); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]);
        }

        ggml_free(ctx);
    }

    return 0;
}